

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O0

void __thiscall
flatbuffers::BinaryAnnotator::BinaryAnnotator
          (BinaryAnnotator *this,uint8_t *bfbs,uint64_t bfbs_length,uint8_t *binary,
          uint64_t binary_length,bool is_size_prefixed)

{
  Schema *pSVar1;
  allocator<char> local_32;
  byte local_31;
  uint64_t uStack_30;
  bool is_size_prefixed_local;
  uint64_t binary_length_local;
  uint8_t *binary_local;
  uint64_t bfbs_length_local;
  uint8_t *bfbs_local;
  BinaryAnnotator *this_local;
  
  this->bfbs_ = bfbs;
  this->bfbs_length_ = bfbs_length;
  local_31 = is_size_prefixed;
  uStack_30 = binary_length;
  binary_length_local = (uint64_t)binary;
  binary_local = (uint8_t *)bfbs_length;
  bfbs_length_local = (uint64_t)bfbs;
  bfbs_local = (uint8_t *)this;
  pSVar1 = reflection::GetSchema(bfbs);
  this->schema_ = pSVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->root_table_,"",&local_32);
  std::allocator<char>::~allocator(&local_32);
  this->binary_ = (uint8_t *)binary_length_local;
  this->binary_length_ = uStack_30;
  this->is_size_prefixed_ = (bool)(local_31 & 1);
  std::
  map<unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
  ::map(&this->vtables_);
  std::
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  ::map(&this->sections_);
  return;
}

Assistant:

explicit BinaryAnnotator(const uint8_t *const bfbs,
                           const uint64_t bfbs_length,
                           const uint8_t *const binary,
                           const uint64_t binary_length,
                           const bool is_size_prefixed)
      : bfbs_(bfbs),
        bfbs_length_(bfbs_length),
        schema_(reflection::GetSchema(bfbs)),
        root_table_(""),
        binary_(binary),
        binary_length_(binary_length),
        is_size_prefixed_(is_size_prefixed) {}